

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O0

ON_UuidPtr * __thiscall ON_UuidPtrList::SearchHelper(ON_UuidPtrList *this,ON_UUID *uuid)

{
  int iVar1;
  ON_UuidPtr *local_38;
  uint local_24;
  int i;
  ON_UuidPtr *p;
  ON_UUID *uuid_local;
  ON_UuidPtrList *this_local;
  
  if ((8 < (this->super_ON_SimpleArray<ON_UuidPtr>).m_count - this->m_sorted_count) ||
     (this->m_removed_count != 0)) {
    ImproveSearchSpeed(this);
  }
  if (this->m_sorted_count == 0) {
    local_38 = (ON_UuidPtr *)0x0;
  }
  else {
    local_38 = (ON_UuidPtr *)
               bsearch(uuid,(this->super_ON_SimpleArray<ON_UuidPtr>).m_a,(ulong)this->m_sorted_count
                       ,0x18,compar_uuidptr_uuid);
  }
  if (local_38 == (ON_UuidPtr *)0x0) {
    for (local_24 = this->m_sorted_count;
        (int)local_24 < (this->super_ON_SimpleArray<ON_UuidPtr>).m_count; local_24 = local_24 + 1) {
      iVar1 = ON_UuidList::CompareUuid
                        (uuid,&(this->super_ON_SimpleArray<ON_UuidPtr>).m_a[(int)local_24].m_id);
      if (iVar1 == 0) {
        return (this->super_ON_SimpleArray<ON_UuidPtr>).m_a + (int)local_24;
      }
    }
  }
  return local_38;
}

Assistant:

ON_UuidPtr* ON_UuidPtrList::SearchHelper(const ON_UUID* uuid) const
{
  if ( m_count - m_sorted_count > 8 || m_removed_count > 0 )
  {
    // time to resort the array so that the speedy
    // bsearch() can be used to find uuids
    const_cast<ON_UuidPtrList*>(this)->ImproveSearchSpeed();
  }

  ON_UuidPtr* p = (m_sorted_count > 0 )
                   ? (ON_UuidPtr*)bsearch( uuid, m_a, m_sorted_count, 
                                        sizeof(m_a[0]), 
                                        (int(*)(const void*,const void*))compar_uuidptr_uuid ) 
                   : 0;
  if (0 == p)
  {
    // do a slow search on the last m_count-m_sort_count elements
    // in the array.
    int i;
    for ( i = m_sorted_count; i < m_count; i++ )
    {
      if ( 0 == ON_UuidList::CompareUuid(uuid,&m_a[i].m_id) )
      {
        p = m_a+i;
        break;
      }
    }
  }

  return p;
}